

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

uint8_t absl::strings_internal::CordTestAccess::LengthToTag(size_t s)

{
  uint8_t uVar1;
  AlphaNum *in_RCX;
  int local_c8 [2];
  char *local_c0;
  char *absl_raw_log_internal_filename;
  AlphaNum local_88;
  string local_58;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string death_message;
  size_t s_local;
  
  death_message.field_2._8_8_ = s;
  if (s < 0xff4) {
    uVar1 = cord_internal::AllocatedSizeToTag(s + 0xd);
    return uVar1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,"Check s <= kMaxFlatLength failed: ",&local_31);
  std::allocator<char>::~allocator(&local_31);
  AlphaNum::AlphaNum(&local_88,"Invalid length ");
  AlphaNum::AlphaNum((AlphaNum *)&absl_raw_log_internal_filename,death_message.field_2._8_8_);
  StrCat_abi_cxx11_(&local_58,(absl *)&local_88,(AlphaNum *)&absl_raw_log_internal_filename,in_RCX);
  std::__cxx11::string::operator+=((string *)local_30,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/strings/cord.cc"
  ;
  local_c8[1] = 3;
  local_c8[0] = 0x622;
  base_internal::AtomicHook<void(*)(absl::LogSeverity,char_const*,int,std::__cxx11::string_const&)>
  ::operator()((AtomicHook<void(*)(absl::LogSeverity,char_const*,int,std::__cxx11::string_const&)> *
               )raw_log_internal::internal_log_function_abi_cxx11_,(LogSeverity *)(local_c8 + 1),
               &local_c0,local_c8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/strings/cord.cc"
                ,0x622,"static uint8_t absl::strings_internal::CordTestAccess::LengthToTag(size_t)")
  ;
}

Assistant:

uint8_t CordTestAccess::LengthToTag(size_t s) {
  ABSL_INTERNAL_CHECK(s <= kMaxFlatLength, absl::StrCat("Invalid length ", s));
  return cord_internal::AllocatedSizeToTag(s + cord_internal::kFlatOverhead);
}